

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

bool __thiscall Catch::clara::TextFlow::Column::iterator::isBoundary(iterator *this,size_t at)

{
  bool bVar1;
  long lVar2;
  string *psVar3;
  long in_RSI;
  bool local_11;
  char c;
  
  lVar2 = in_RSI;
  line_abi_cxx11_((iterator *)0x18d076);
  c = (char)((ulong)lVar2 >> 0x38);
  lVar2 = ::std::__cxx11::string::size();
  local_11 = true;
  if (in_RSI != lVar2) {
    psVar3 = line_abi_cxx11_((iterator *)0x18d09e);
    ::std::__cxx11::string::operator[]((ulong)psVar3);
    bVar1 = isWhitespace(c);
    if (bVar1) {
      psVar3 = line_abi_cxx11_((iterator *)0x18d0c2);
      ::std::__cxx11::string::operator[]((ulong)psVar3);
      bVar1 = isWhitespace(c);
      if (!bVar1) {
        return true;
      }
    }
    psVar3 = line_abi_cxx11_((iterator *)0x18d0f3);
    ::std::__cxx11::string::operator[]((ulong)psVar3);
    bVar1 = isBreakableBefore(c);
    local_11 = true;
    if (!bVar1) {
      psVar3 = line_abi_cxx11_((iterator *)0x18d11e);
      ::std::__cxx11::string::operator[]((ulong)psVar3);
      local_11 = isBreakableAfter(c);
    }
  }
  return local_11;
}

Assistant:

auto isBoundary(size_t at) const -> bool {
			assert(at > 0);
			assert(at <= line().size());

			return at == line().size() ||
				(isWhitespace(line()[at]) && !isWhitespace(line()[at - 1])) ||
				isBreakableBefore(line()[at]) ||
				isBreakableAfter(line()[at - 1]);
		}